

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O2

int __thiscall CVmObjStringBuffer::equals_str(CVmObjStringBuffer *this,char *str)

{
  int iVar1;
  wchar_t wVar2;
  int *piVar3;
  uint uVar4;
  wchar_t wVar5;
  size_t sVar6;
  char *p;
  int iVar7;
  long lVar8;
  
  piVar3 = (int *)(this->super_CVmObject).ext_;
  iVar1 = *piVar3;
  p = str + 2;
  sVar6 = utf8_ptr::s_len(p,(ulong)*(ushort *)str);
  uVar4 = 0;
  if (iVar1 == (int)sVar6) {
    lVar8 = 0;
    iVar7 = 0;
    if (0 < iVar1) {
      iVar7 = iVar1;
    }
    for (; iVar7 != (int)lVar8; lVar8 = lVar8 + 1) {
      wVar2 = piVar3[lVar8 + 3];
      wVar5 = utf8_ptr::s_getch(p);
      if (wVar2 != wVar5) break;
      p = utf8_ptr::s_inc(p);
    }
    uVar4 = (uint)(iVar1 <= (int)lVar8);
  }
  return uVar4;
}

Assistant:

int CVmObjStringBuffer::equals_str(const char *str) const
{
    /* get the buffer pointers and character lengths */
    const wchar_t *p1 = get_ext()->buf;
    utf8_ptr p2((char *)str + VMB_LEN);
    int32_t len1 = get_ext()->len, len2 = p2.len(vmb_get_len(str));

    /* if the lengths don't match, we can't be equal */
    if (len1 != len2)
        return FALSE;

    /* compare character by character */
    for (int32_t i = 0 ; i < len1 ; ++i, ++p1, p2.inc())
    {
        if (*p1 != p2.getch())
            return FALSE;
    }

    /* the characters match */
    return TRUE;
}